

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::clara::TextFlow::Column::iterator::isBoundary(iterator *this,size_t at)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  string *psVar4;
  ulong in_RSI;
  bool local_21;
  char c;
  
  if (in_RSI == 0) {
    __assert_fail("at > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/olegtarasov[P]fastText/src/catch.hpp"
                  ,0x2144,"bool Catch::clara::TextFlow::Column::iterator::isBoundary(size_t) const")
    ;
  }
  uVar3 = in_RSI;
  line_abi_cxx11_((iterator *)0x17e545);
  uVar2 = ::std::__cxx11::string::size();
  if (uVar3 <= uVar2) {
    line_abi_cxx11_((iterator *)0x17e58f);
    c = (char)(uVar3 >> 0x38);
    uVar3 = ::std::__cxx11::string::size();
    local_21 = true;
    if (in_RSI != uVar3) {
      psVar4 = line_abi_cxx11_((iterator *)0x17e5b8);
      ::std::__cxx11::string::operator[]((ulong)psVar4);
      bVar1 = isWhitespace(c);
      if (bVar1) {
        psVar4 = line_abi_cxx11_((iterator *)0x17e5dd);
        ::std::__cxx11::string::operator[]((ulong)psVar4);
        bVar1 = isWhitespace(c);
        if (!bVar1) {
          return true;
        }
      }
      psVar4 = line_abi_cxx11_((iterator *)0x17e60f);
      ::std::__cxx11::string::operator[]((ulong)psVar4);
      bVar1 = isBreakableBefore(c);
      local_21 = true;
      if (!bVar1) {
        psVar4 = line_abi_cxx11_((iterator *)0x17e63b);
        ::std::__cxx11::string::operator[]((ulong)psVar4);
        local_21 = isBreakableAfter(c);
      }
    }
    return local_21;
  }
  __assert_fail("at <= line().size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/olegtarasov[P]fastText/src/catch.hpp"
                ,0x2145,"bool Catch::clara::TextFlow::Column::iterator::isBoundary(size_t) const");
}

Assistant:

auto isBoundary(size_t at) const -> bool {
			assert(at > 0);
			assert(at <= line().size());

			return at == line().size() ||
				(isWhitespace(line()[at]) && !isWhitespace(line()[at - 1])) ||
				isBreakableBefore(line()[at]) ||
				isBreakableAfter(line()[at - 1]);
		}